

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int libssh2_init(int flags)

{
  int flags_local;
  
  if ((_libssh2_initialized == 0) && ((flags & 1U) == 0)) {
    OPENSSL_init_crypto(0xc,0);
    ENGINE_load_builtin_engines();
    ENGINE_register_all_complete();
    _libssh2_init_aes_ctr();
  }
  _libssh2_initialized = _libssh2_initialized + 1;
  _libssh2_init_flags = flags | _libssh2_init_flags;
  return 0;
}

Assistant:

LIBSSH2_API int
libssh2_init(int flags)
{
    if (_libssh2_initialized == 0 && !(flags & LIBSSH2_INIT_NO_CRYPTO)) {
        libssh2_crypto_init();
        _libssh2_init_aes_ctr();
    }

    _libssh2_initialized++;
    _libssh2_init_flags |= flags;

    return 0;
}